

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O2

void CfdcapiPsbtDumpLog(int result,void *handle)

{
  int iVar1;
  char *message;
  AssertHelper AStack_38;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertionResult gtest_ar;
  char *output;
  
  if (result != 0) {
    output = (char *)0x0;
    iVar1 = CfdGetLastErrorMessage(handle,&output);
    if (iVar1 == 0) {
      message = "";
      testing::internal::CmpHelperSTREQ((internal *)&gtest_ar,"\"\"","output","",output);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_30);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x2d,message);
        testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_30);
        testing::internal::AssertHelper::~AssertHelper(&AStack_38);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_30);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
  }
  return;
}

Assistant:

static void CfdcapiPsbtDumpLog(int result, void* handle) {
  if (result != kCfdSuccess) {
    char* output = nullptr;
    int ret = CfdGetLastErrorMessage(handle, &output);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("", output);
    }
  }
}